

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  long lVar3;
  undefined8 uVar4;
  undefined7 in_register_00000031;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> SVar5;
  OpResult OVar6;
  
  bVar1 = (this->super_CordRep).storage[1];
  if ((int)CONCAT71(in_register_00000031,owned) == 0) {
    pCVar2 = CopyRaw(this,(this->super_CordRep).length);
    SVar5 = Edges(this,(ulong)(this->super_CordRep).storage[1] + 1,
                  (ulong)(this->super_CordRep).storage[2]);
    uVar4 = 1;
    for (lVar3 = 0; SVar5.len_ << 3 != lVar3; lVar3 = lVar3 + 8) {
      CordRep::Ref(*(CordRep **)((long)SVar5.ptr_ + lVar3));
    }
  }
  else {
    CordRep::Unref(this->edges_[bVar1]);
    uVar4 = 0;
    pCVar2 = this;
  }
  pCVar2->edges_[bVar1] = edge;
  (pCVar2->super_CordRep).length = (pCVar2->super_CordRep).length + delta;
  OVar6._8_8_ = uVar4;
  OVar6.tree = pCVar2;
  return OVar6;
}

Assistant:

OpResult CordRepBtree::SetEdge(bool owned, CordRep* edge, size_t delta) {
  OpResult result;
  const size_t idx = index(edge_type);
  if (owned) {
    result = {this, kSelf};
    CordRep::Unref(edges_[idx]);
  } else {
    // Create a copy containing all unchanged edges. Unchanged edges are the
    // open interval [begin, back) or [begin + 1, end) depending on `edge_type`.
    // We conveniently cover both case using a constexpr `shift` being 0 or 1
    // as `end :== back + 1`.
    result = {CopyRaw(length), kCopied};
    constexpr int shift = edge_type == kFront ? 1 : 0;
    for (CordRep* r : Edges(begin() + shift, back() + shift)) {
      CordRep::Ref(r);
    }
  }
  result.tree->edges_[idx] = edge;
  result.tree->length += delta;
  return result;
}